

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Read3dmGoo(ON_BinaryArchive *this,ON_3dmGoo *goo)

{
  ON_3DM_BIG_CHUNK *this_00;
  ON__UINT64 OVar1;
  uchar *puVar2;
  size_t sizeof_goo;
  ON_3DM_BIG_CHUNK *c;
  bool rc;
  ON_3dmGoo *goo_local;
  ON_BinaryArchive *this_local;
  
  c._7_1_ = false;
  if (goo->m_goo != (uchar *)0x0) {
    onfree(goo->m_goo);
    goo->m_goo = (uchar *)0x0;
  }
  goo->m_typecode = 0;
  goo->m_value = 0;
  this_00 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
  if (this_00 != (ON_3DM_BIG_CHUNK *)0x0) {
    goo->m_typecode = this_00->m_typecode;
    if (this_00->m_bLongChunk == '\0') {
      c._7_1_ = DownSizeINT(this_00->m_big_value,&goo->m_value);
    }
    else {
      OVar1 = ON_3DM_BIG_CHUNK::Length(this_00);
      c._7_1_ = DownSizeUINT(OVar1,(ON__UINT32 *)&goo->m_value);
    }
    if ((((c._7_1_ != false) && (this_00->m_bLongChunk != '\0')) && (0 < this_00->m_big_value)) &&
       (OVar1 = CurrentPosition(this), OVar1 == this_00->m_start_offset)) {
      this_00->m_do_crc16 = '\0';
      this_00->m_do_crc32 = '\0';
      this->m_bDoChunkCRC = false;
      OVar1 = ON_3DM_BIG_CHUNK::Length(this_00);
      puVar2 = (uchar *)onmalloc(OVar1);
      goo->m_goo = puVar2;
      c._7_1_ = ReadByte(this,OVar1,goo->m_goo);
    }
  }
  return c._7_1_;
}

Assistant:

bool ON_BinaryArchive::Read3dmGoo( ON_3dmGoo& goo )
{
  // goo is an entire "chunk" that is not short.
  // A call to EndRead3dmChunk() must immediately follow 
  // the call to Read3dmGoo().
  bool rc = false;
  if (goo.m_goo) 
  {
    onfree(goo.m_goo);
    goo.m_goo = 0;
  }
  goo.m_typecode = 0;
  goo.m_value = 0;
  ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if (c) 
  {
    goo.m_typecode = c->m_typecode;
    if ( c->m_bLongChunk )
      rc = DownSizeUINT(c->Length(),(ON__UINT32*)&goo.m_value);
    else
      rc = DownSizeINT(c->m_big_value,&goo.m_value);
    if ( rc && c->m_bLongChunk && c->m_big_value > 0 ) 
    {
      if ( CurrentPosition() == c->m_start_offset )
      {
        // read the rest of this chunk into the goo.m_goo buffer.
        // 23 January 2004 Dale Lear:
        //   Have to turn of CRC checking because the goo may contiain
        //   subchunks.  If a CRC exixts, it is at the end of the
        //   goo and will persist until the application that
        //   wrote this chunk is available to parse the chunk.
        c->m_do_crc16 = 0;
        c->m_do_crc32 = 0;
        m_bDoChunkCRC = false;
        size_t sizeof_goo = (size_t)c->Length();
        goo.m_goo = (unsigned char*)onmalloc( sizeof_goo );
        rc = ReadByte( sizeof_goo, goo.m_goo );
      }
    }
  }
  return rc;
}